

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwtUtil.c
# Opt level: O0

void Rwt_Trav_rec(Rwt_Man_t *p,Rwt_Node_t *pNode,int *pVolume)

{
  Rwt_Node_t *pRVar1;
  int *pVolume_local;
  Rwt_Node_t *pNode_local;
  Rwt_Man_t *p_local;
  
  if (((*(uint *)&pNode->field_0x8 >> 0x1e & 1) == 0) && (pNode->TravId != p->nTravIds)) {
    pNode->TravId = p->nTravIds;
    *pVolume = *pVolume + 1;
    if (*(int *)&pNode->field_0x8 < 0) {
      *pVolume = *pVolume + 1;
    }
    pRVar1 = Rwt_Regular(pNode->p0);
    Rwt_Trav_rec(p,pRVar1,pVolume);
    pRVar1 = Rwt_Regular(pNode->p1);
    Rwt_Trav_rec(p,pRVar1,pVolume);
  }
  return;
}

Assistant:

void Rwt_Trav_rec( Rwt_Man_t * p, Rwt_Node_t * pNode, int * pVolume )
{
    if ( pNode->fUsed || pNode->TravId == p->nTravIds )
        return;
    pNode->TravId = p->nTravIds;
    (*pVolume)++;
    if ( pNode->fExor )
        (*pVolume)++;
    Rwt_Trav_rec( p, Rwt_Regular(pNode->p0), pVolume );
    Rwt_Trav_rec( p, Rwt_Regular(pNode->p1), pVolume );
}